

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaCorot_8::ComputeInternalForces
          (ChElementHexaCorot_8 *this,ChVectorDynamic<> *Fi)

{
  ChMatrix33<double> *R;
  element_type *peVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ChVectorDynamic<> displ;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_108;
  ChVectorDynamic<> FiK_local;
  ChMatrixDynamic<> FiR_local;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_c8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_88;
  ChMatrixRef local_58;
  
  lVar3 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  iVar2 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])();
  if (lVar3 == iVar2) {
    local_c8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data._0_4_ = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&displ,(int *)&local_c8);
    (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[0xb])(this,&displ);
    local_c8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    ._0_16_ = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->StiffnessMatrix,
                         (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&displ);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&FiK_local,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_c8);
    R = &(this->super_ChElementCorotational).A;
    lVar4 = 0;
    for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 3) {
      local_108.m_matrix = &R->super_Matrix<double,_3,_3,_1,_3,_3>;
      chrono::operator*(&local_108,
                        (ChVector<double> *)
                        (*(long *)((long)&(((this->nodes).
                                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + lVar4) + 0x38));
      FiR_local.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
           (double *)&local_88;
      Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_c8,&displ,lVar3,3
                );
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
                ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_c8,
                 (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)&FiR_local);
      lVar4 = lVar4 + 0x10;
    }
    local_108.m_matrix =
         (non_const_type)
         ((this->Material).
          super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         damping_K;
    Eigen::operator*(&local_88,(double *)&local_108,(StorageBaseType *)&this->StiffnessMatrix);
    Eigen::
    Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>
    ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
               *)&local_c8,&local_88,&displ);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&FiR_local,
               (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_c8);
    peVar1 = (this->Material).
             super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_c8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)
              (this->Volume * (peVar1->super_ChContinuumMaterial).density * 0.125 *
              peVar1->damping_M);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&displ,(Scalar *)&local_c8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&FiR_local,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&displ);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&FiK_local,
               (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&FiR_local);
    local_c8.
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
    .
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
    .m_data = (PointerType)&DAT_bff0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&FiK_local,(Scalar *)&local_c8)
    ;
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_c8,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&FiK_local,(type *)0x0);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>> *)&local_58,
               &Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(type *)0x0);
    ChMatrixCorotation::ComputeCK(&local_c8,R,8,&local_58);
    Eigen::internal::handmade_aligned_free
              (local_c8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data);
    Eigen::internal::handmade_aligned_free
              (FiR_local.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
               m_data);
    Eigen::internal::handmade_aligned_free
              (FiK_local.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    Eigen::internal::handmade_aligned_free
              (displ.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              );
    return;
  }
  __assert_fail("Fi.size() == GetNdofs()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementHexaCorot_8.cpp"
                ,0x156,
                "virtual void chrono::fea::ChElementHexaCorot_8::ComputeInternalForces(ChVectorDynamic<> &)"
               );
}

Assistant:

void ChElementHexaCorot_8::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == GetNdofs());

    // set up vector of nodal displacements (in local element system) u_l = R*p - p0
    ChVectorDynamic<> displ(GetNdofs());
    this->GetStateBlock(displ);

    // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
    ChVectorDynamic<> FiK_local = StiffnessMatrix * displ;

    for (int in = 0; in < 8; ++in) {
        displ.segment(in * 3, 3) = (A.transpose() * nodes[in]->pos_dt).eigen();  // nodal speeds, local
    }
    ChMatrixDynamic<> FiR_local = Material->Get_RayleighDampingK() * StiffnessMatrix * displ;

    double lumped_node_mass = (this->Volume * this->Material->Get_density()) / 8.0;
    displ *= (lumped_node_mass * Material->Get_RayleighDampingM());
    FiR_local += displ;

    //***TO DO*** better per-node lumping, or 12x12 consistent mass matrix.

    FiK_local += FiR_local;
    FiK_local *= -1.0;

    // Fi = C * Fi_local  with C block-diagonal rotations A
    ChMatrixCorotation::ComputeCK(FiK_local, this->A, 8, Fi);
}